

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

bool __thiscall Json::StyledWriter::isMultilineArray(StyledWriter *this,Value *value)

{
  ArrayIndex AVar1;
  Value *pVVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  AVar1 = Value::size(value);
  bVar7 = this->rightMargin_ <= AVar1 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  if (AVar1 != 0 && !bVar7) {
    uVar4 = 1;
    do {
      pVVar2 = Value::operator[](value,uVar4 - 1);
      bVar7 = Value::isArray(pVVar2);
      if (bVar7) {
LAB_00156f9f:
        bVar7 = Value::empty(pVVar2);
        bVar7 = !bVar7;
      }
      else {
        bVar7 = Value::isObject(pVVar2);
        if (bVar7) goto LAB_00156f9f;
        bVar7 = false;
      }
    } while ((uVar4 < AVar1) && (uVar4 = uVar4 + 1, bVar7 == false));
  }
  if (bVar7 == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar1);
    this->addChildValues_ = true;
    uVar4 = AVar1 * 2 + 2;
    bVar3 = 0;
    if (AVar1 != 0) {
      lVar5 = 8;
      uVar6 = 0;
      do {
        pVVar2 = Value::operator[](value,(ArrayIndex)uVar6);
        bVar7 = hasCommentForValue(pVVar2);
        if (bVar7) {
          bVar3 = 1;
        }
        pVVar2 = Value::operator[](value,(ArrayIndex)uVar6);
        writeValue(this,pVVar2);
        uVar4 = uVar4 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar5);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (AVar1 != uVar6);
    }
    this->addChildValues_ = false;
    bVar7 = (bool)(this->rightMargin_ <= uVar4 | bVar3);
  }
  return bVar7;
}

Assistant:

bool StyledWriter::isMultilineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}